

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O2

void Aig_ManChoiceLevel_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  Tim_Man_t *p_00;
  int iVar1;
  int i;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  if (pObj->TravId == p->nTravIds) {
    return;
  }
  pObj->TravId = p->nTravIds;
  uVar6 = (uint)*(undefined8 *)&pObj->field_0x18;
  uVar5 = uVar6 & 7;
  if (uVar5 == 3) {
    pAVar4 = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
    Aig_ManChoiceLevel_rec(p,pAVar4);
    iVar1 = Aig_ObjLevel(pAVar4);
    if (iVar1 != 0) {
LAB_0051bd14:
      uVar6 = Aig_ObjLevel(pAVar4);
      goto LAB_0051bdd5;
    }
  }
  else {
    if (uVar5 == 2) {
      p_00 = (Tim_Man_t *)p->pManTime;
      uVar6 = 0;
      if (p_00 != (Tim_Man_t *)0x0) {
        iVar1 = Aig_ObjCioId(pObj);
        iVar1 = Tim_ManBoxForCi(p_00,iVar1);
        uVar6 = 0;
        if (-1 < iVar1) {
          i = Tim_ManBoxInputFirst((Tim_Man_t *)p->pManTime,iVar1);
          iVar2 = Tim_ManBoxInputNum((Tim_Man_t *)p->pManTime,iVar1);
          iVar1 = 0;
          if (iVar2 < 1) {
            iVar2 = 0;
            iVar1 = 0;
          }
          while (bVar7 = iVar2 != 0, iVar2 = iVar2 + -1, bVar7) {
            pAVar4 = Aig_ManCo(p,i);
            Aig_ManChoiceLevel_rec(p,pAVar4);
            iVar3 = Aig_ObjLevel(pAVar4);
            if (iVar1 < iVar3) {
              iVar1 = Aig_ObjLevel(pAVar4);
            }
            i = i + 1;
          }
          uVar6 = iVar1 + 1;
        }
      }
      goto LAB_0051bdd5;
    }
    if (0xfffffffd < (uVar6 & 7) - 7) {
      pAVar4 = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
      Aig_ManChoiceLevel_rec(p,pAVar4);
      iVar1 = Aig_ObjLevel(pAVar4);
      if (iVar1 == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = Aig_ObjLevel(pAVar4);
      }
      pAVar4 = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
      Aig_ManChoiceLevel_rec(p,pAVar4);
      uVar5 = Aig_ObjLevel(pAVar4);
      if (uVar6 < uVar5) {
        uVar6 = Aig_ObjLevel(pAVar4);
      }
      uVar6 = uVar6 + 1;
      if ((p->pEquivs == (Aig_Obj_t **)0x0) ||
         (pAVar4 = p->pEquivs[pObj->Id], pAVar4 == (Aig_Obj_t *)0x0)) goto LAB_0051bdd5;
      Aig_ManChoiceLevel_rec(p,pAVar4);
      uVar5 = Aig_ObjLevel(pAVar4);
      if (uVar5 <= uVar6) goto LAB_0051bdd5;
      goto LAB_0051bd14;
    }
    iVar1 = Aig_ObjIsConst1(pObj);
    if (iVar1 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                    ,0x236,"void Aig_ManChoiceLevel_rec(Aig_Man_t *, Aig_Obj_t *)");
    }
  }
  uVar6 = 0;
LAB_0051bdd5:
  Aig_ObjSetLevel(pObj,uVar6);
  return;
}

Assistant:

void Aig_ManChoiceLevel_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pNext;
    int i, iBox, iTerm1, nTerms, LevelMax = 0;
    if ( Aig_ObjIsTravIdCurrent( p, pObj ) )
        return;
    Aig_ObjSetTravIdCurrent( p, pObj );
    if ( Aig_ObjIsCi(pObj) )
    {
        if ( p->pManTime )
        {
            iBox = Tim_ManBoxForCi( (Tim_Man_t *)p->pManTime, Aig_ObjCioId(pObj) );
            if ( iBox >= 0 ) // this is not a true PI
            {
                iTerm1 = Tim_ManBoxInputFirst( (Tim_Man_t *)p->pManTime, iBox );
                nTerms = Tim_ManBoxInputNum( (Tim_Man_t *)p->pManTime, iBox );
                for ( i = 0; i < nTerms; i++ )
                {
                    pNext = Aig_ManCo(p, iTerm1 + i);
                    Aig_ManChoiceLevel_rec( p, pNext );
                    if ( LevelMax < Aig_ObjLevel(pNext) )
                        LevelMax = Aig_ObjLevel(pNext);
                }
                LevelMax++;
            }
        }
//        printf( "%d ", pObj->Level );
    }
    else if ( Aig_ObjIsCo(pObj) )
    {
        pNext = Aig_ObjFanin0(pObj);
        Aig_ManChoiceLevel_rec( p, pNext );
        if ( LevelMax < Aig_ObjLevel(pNext) )
            LevelMax = Aig_ObjLevel(pNext);
    }
    else if ( Aig_ObjIsNode(pObj) )
    { 
        // get the maximum level of the two fanins
        pNext = Aig_ObjFanin0(pObj);
        Aig_ManChoiceLevel_rec( p, pNext );
        if ( LevelMax < Aig_ObjLevel(pNext) )
            LevelMax = Aig_ObjLevel(pNext);
        pNext = Aig_ObjFanin1(pObj);
        Aig_ManChoiceLevel_rec( p, pNext );
        if ( LevelMax < Aig_ObjLevel(pNext) )
            LevelMax = Aig_ObjLevel(pNext);
        LevelMax++;

        // get the level of the nodes in the choice node
        if ( p->pEquivs && (pNext = Aig_ObjEquiv(p, pObj)) )
        {
            Aig_ManChoiceLevel_rec( p, pNext );
            if ( LevelMax < Aig_ObjLevel(pNext) )
                LevelMax = Aig_ObjLevel(pNext);
        }
    }
    else if ( !Aig_ObjIsConst1(pObj) )
        assert( 0 );
    Aig_ObjSetLevel( pObj, LevelMax );
}